

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

QWindowGeometrySpecification * QWindowGeometrySpecification::fromArgument(QByteArray *a)

{
  long lVar1;
  QWindowGeometrySpecification *in_RDI;
  long in_FS_OFFSET;
  int value;
  int i;
  char op;
  int pos;
  QWindowGeometrySpecification *pos_00;
  int in_stack_ffffffffffffffe0;
  int iVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->corner = TopLeftCorner;
  in_RDI->xOffset = -1;
  in_RDI->yOffset = -1;
  in_RDI->width = -1;
  in_RDI->height = -1;
  iVar2 = 0;
  pos_00 = in_RDI;
  while ((iVar2 < 4 &&
         (in_stack_ffffffffffffffe0 =
               nextGeometryToken((QByteArray *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                                 (int *)pos_00,(char *)in_RDI), -1 < in_stack_ffffffffffffffe0))) {
    iVar2 = iVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pos_00;
  }
  __stack_chk_fail();
}

Assistant:

QWindowGeometrySpecification QWindowGeometrySpecification::fromArgument(const QByteArray &a)
{
    QWindowGeometrySpecification result = Q_WINDOW_GEOMETRY_SPECIFICATION_INITIALIZER;
    int pos = 0;
    for (int i = 0; i < 4; ++i) {
        char op;
        const int value = nextGeometryToken(a, pos, &op);
        if (value < 0)
            break;
        switch (op) {
        case 'x':
            (result.width >= 0 ? result.height : result.width) = value;
            break;
        case '+':
        case '-':
            if (result.xOffset >= 0) {
                result.yOffset = value;
                if (op == '-')
                    result.corner = result.corner == Qt::TopRightCorner ? Qt::BottomRightCorner : Qt::BottomLeftCorner;
            } else {
                result.xOffset = value;
                if (op == '-')
                    result.corner = Qt::TopRightCorner;
            }
        }
    }
    return result;
}